

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O2

bool dxil_spv::emit_raw_buffer_load_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  TypeID TVar2;
  uint uVar3;
  Id IVar4;
  CallInst *pCVar5;
  Value *pVVar6;
  mapped_type *pmVar7;
  Type *pTVar8;
  LoggingCallback p_Var9;
  void *pvVar10;
  Id ptr_id;
  char buffer [4096];
  
  if (((impl->ags).num_instructions == 1) &&
     (pCVar5 = (CallInst *)LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2),
     pCVar5 == (impl->ags).backdoor_instructions[0])) {
    pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
    (impl->ags).active_uav_ptr = IVar4;
    (impl->ags).active_uav_op = RawBufferLoad;
    (impl->ags).active_read_backdoor = (Value *)instruction;
    return true;
  }
  bVar1 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
  if (!bVar1) {
    return true;
  }
  pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  ptr_id = Converter::Impl::get_id_for_value(impl,pVVar6,0);
  pmVar7 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&impl->handle_to_resource_meta,&ptr_id);
  if (pmVar7->storage != StorageClassPhysicalStorageBuffer) {
    pTVar8 = LLVMBC::Value::getType((Value *)instruction);
    pTVar8 = LLVMBC::Type::getStructElementType(pTVar8,0);
    TVar2 = LLVMBC::Type::getTypeID(pTVar8);
    if ((TVar2 != FloatTyID) &&
       (((TVar2 = LLVMBC::Type::getTypeID(pTVar8), TVar2 != IntegerTyID ||
         (uVar3 = LLVMBC::Type::getIntegerBitWidth(pTVar8), uVar3 != 0x20)) &&
        (pmVar7->storage != StorageClassStorageBuffer)))) {
      p_Var9 = get_thread_log_callback();
      if (p_Var9 == (LoggingCallback)0x0) {
        fwrite("[ERROR]: 16 or 64-bit RawBufferLoad on descriptors is only supported for SSBOs.\n",
               0x50,1,_stderr);
        fflush(_stderr);
      }
      else {
        memcpy(buffer,"16 or 64-bit RawBufferLoad on descriptors is only supported for SSBOs.\n",
               0x48);
        pvVar10 = get_thread_log_callback_userdata();
        (*p_Var9)(pvVar10,Error,buffer);
      }
      return false;
    }
    bVar1 = emit_buffer_load_instruction(impl,instruction);
    return bVar1;
  }
  bVar1 = emit_physical_buffer_load_instruction(impl,instruction,&pmVar7->physical_pointer_meta,0,0)
  ;
  return bVar1;
}

Assistant:

bool emit_raw_buffer_load_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	if (impl.ags.num_instructions == 1)
	{
		if (instruction->getOperand(2) == impl.ags.backdoor_instructions[0])
		{
			impl.ags.active_uav_ptr = impl.get_id_for_value(instruction->getOperand(1));
			impl.ags.active_uav_op = DXIL::Op::RawBufferLoad;
			impl.ags.active_read_backdoor = instruction;
			return true;
		}
	}

	if (!impl.composite_is_accessed(instruction))
		return true;

	spv::Id ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	const auto &meta = impl.handle_to_resource_meta[ptr_id];

	if (meta.storage != spv::StorageClassPhysicalStorageBuffer)
	{
		auto *ret_component = instruction->getType()->getStructElementType(0);
		if (ret_component->getTypeID() != llvm::Type::TypeID::FloatTyID &&
		    !(ret_component->getTypeID() == llvm::Type::TypeID::IntegerTyID &&
		      ret_component->getIntegerBitWidth() == 32) &&
		    meta.storage != spv::StorageClassStorageBuffer)
		{
			LOGE("16 or 64-bit RawBufferLoad on descriptors is only supported for SSBOs.\n");
			return false;
		}

		// Ignore the mask. We'll read too much, but robustness should take care of any OOB.
		return emit_buffer_load_instruction(impl, instruction);
	}
	else
		return emit_physical_buffer_load_instruction(impl, instruction, meta.physical_pointer_meta);
}